

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O2

Matrix InputMatrix(istream *f)

{
  istream *this;
  istream *this_00;
  Matrix ppdVar1;
  long lVar2;
  long lVar3;
  char check;
  int ncols;
  int nrows;
  
  this = std::operator>>(f,&check);
  this_00 = (istream *)std::istream::operator>>((istream *)this,&nrows);
  std::istream::operator>>(this_00,&ncols);
  if (check == 'M') {
    ppdVar1 = NewMatrix(nrows,ncols);
    for (lVar3 = 0; lVar3 < nrows; lVar3 = lVar3 + 1) {
      for (lVar2 = 0; lVar2 < ncols; lVar2 = lVar2 + 1) {
        std::istream::_M_extract<double>((double *)f);
      }
    }
  }
  else {
    std::ios::clear((int)f + (int)*(undefined8 *)(*(long *)f + -0x18));
    ppdVar1 = (Matrix)0x0;
  }
  return ppdVar1;
}

Assistant:

Matrix
InputMatrix(std::istream &f)
{
  Matrix m;
  int i, j;
  char check;
  int nrows, ncols;

  f >> check >> nrows >> ncols;
  if (check != 'M') {
    f.clear(std::ios::badbit);
    return nullptr;
  }
  m = NewMatrix(nrows, ncols);
  for (i = 0; i < nrows; i++)
    for (j = 0; j < ncols; j++)
      f >> m[i][j];
  return m;
}